

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonPrettyFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  JsonString *p;
  char *pPretty;
  sqlite3_context *in_RDX;
  int in_ESI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  JsonPretty x;
  JsonString s;
  undefined4 in_stack_ffffffffffffff40;
  u32 i;
  undefined1 local_90 [12];
  u32 in_stack_ffffffffffffff7c;
  sqlite3_value *in_stack_ffffffffffffff80;
  sqlite3_context *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_90,0xaa,0x88);
  memset(&stack0xffffffffffffff50,0,0x20);
  p = (JsonString *)
      jsonParseFuncArg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
  if (p != (JsonString *)0x0) {
    i = (u32)((ulong)local_90 >> 0x20);
    jsonStringInit((JsonString *)CONCAT44(in_ESI,in_stack_ffffffffffffff40),in_RDX);
    if ((in_ESI == 1) ||
       (pPretty = (char *)sqlite3_value_text((sqlite3_value *)0x2305d0),
       (JsonPretty *)pPretty == (JsonPretty *)0x0)) {
      pPretty = "    ";
    }
    else {
      strlen(pPretty);
    }
    jsonTranslateBlobToPrettyText((JsonPretty *)pPretty,i);
    jsonReturnString(p,in_RDI,(sqlite3_context *)CONCAT44(in_ESI,in_stack_ffffffffffffff40));
    jsonParseFree((JsonParse *)0x230626);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonPrettyFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString s;          /* The output string */
  JsonPretty x;          /* Pretty printing context */

  memset(&x, 0, sizeof(x));
  x.pParse = jsonParseFuncArg(ctx, argv[0], 0);
  if( x.pParse==0 ) return;
  x.pOut = &s;
  jsonStringInit(&s, ctx);
  if( argc==1 || (x.zIndent = (const char*)sqlite3_value_text(argv[1]))==0 ){
    x.zIndent = "    ";
    x.szIndent = 4;
  }else{
    x.szIndent = (u32)strlen(x.zIndent);
  }
  jsonTranslateBlobToPrettyText(&x, 0);
  jsonReturnString(&s, 0, 0);
  jsonParseFree(x.pParse);
}